

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
          (QMovableArrayOps<QRect> *this,qsizetype i,QRect *args)

{
  QRect **ppQVar1;
  qsizetype *pqVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Data *pDVar7;
  QRect *pQVar8;
  Representation RVar9;
  Representation RVar10;
  Representation RVar11;
  qsizetype qVar12;
  long in_FS_OFFSET;
  bool bVar13;
  Inserter local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar7 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.d;
  if ((pDVar7 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>))
  goto LAB_0012aa7c;
  if ((this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.size == i) {
    qVar12 = QArrayDataPointer<QRect>::freeSpaceAtEnd((QArrayDataPointer<QRect> *)this);
    if (qVar12 == 0) goto LAB_0012aa73;
    RVar9.m_i = (args->y1).m_i;
    RVar10.m_i = (args->x2).m_i;
    RVar11.m_i = (args->y2).m_i;
    pQVar8 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.ptr +
             (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.size;
    pQVar8->x1 = (Representation)(args->x1).m_i;
    pQVar8->y1 = (Representation)RVar9.m_i;
    pQVar8->x2 = (Representation)RVar10.m_i;
    pQVar8->y2 = (Representation)RVar11.m_i;
  }
  else {
LAB_0012aa73:
    if (i == 0) {
      qVar12 = QArrayDataPointer<QRect>::freeSpaceAtBegin((QArrayDataPointer<QRect> *)this);
      if (qVar12 == 0) goto LAB_0012aa7c;
      pQVar8 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.ptr;
      RVar9.m_i = (args->y1).m_i;
      RVar10.m_i = (args->x2).m_i;
      RVar11.m_i = (args->y2).m_i;
      pQVar8[-1].x1 = (Representation)(args->x1).m_i;
      pQVar8[-1].y1 = (Representation)RVar9.m_i;
      pQVar8[-1].x2 = (Representation)RVar10.m_i;
      pQVar8[-1].y2 = (Representation)RVar11.m_i;
    }
    else {
LAB_0012aa7c:
      iVar3 = (args->x1).m_i;
      iVar4 = (args->y1).m_i;
      iVar5 = (args->x2).m_i;
      iVar6 = (args->y2).m_i;
      bVar13 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.size != 0;
      QArrayDataPointer<QRect>::detachAndGrow
                ((QArrayDataPointer<QRect> *)this,(uint)(i == 0 && bVar13),1,(QRect **)0x0,
                 (QArrayDataPointer<QRect> *)0x0);
      if (i != 0 || !bVar13) {
        Inserter::Inserter(&local_60,(QArrayDataPointer<QRect> *)this,i,1);
        ((local_60.displaceFrom)->x1).m_i = iVar3;
        ((local_60.displaceFrom)->y1).m_i = iVar4;
        ((local_60.displaceFrom)->x2).m_i = iVar5;
        ((local_60.displaceFrom)->y2).m_i = iVar6;
        (local_60.data)->size = (local_60.data)->size + local_60.nInserts;
        goto LAB_0012ab15;
      }
      pQVar8 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.ptr;
      pQVar8[-1].x1.m_i = iVar3;
      pQVar8[-1].y1.m_i = iVar4;
      pQVar8[-1].x2.m_i = iVar5;
      pQVar8[-1].y2.m_i = iVar6;
    }
    ppQVar1 = &(this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
  }
  pqVar2 = &(this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.size;
  *pqVar2 = *pqVar2 + 1;
LAB_0012ab15:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }